

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O0

size_t __thiscall cs222::Instruction::getLength(Instruction *this)

{
  undefined8 uVar1;
  bool bVar2;
  Type TVar3;
  char *pcVar4;
  pointer pvVar5;
  unsigned_long uVar6;
  string local_d8;
  string local_b8;
  string local_98;
  Format local_74;
  _Node_iterator_base<std::pair<const_cs222::Instruction::Format,_unsigned_long>,_false> local_70;
  string local_68 [48];
  undefined1 local_38 [8];
  string op;
  size_t length;
  Instruction *this_local;
  
  op.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)local_38,(string *)&this->operation);
  pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
  if (*pcVar4 == '+') {
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_38);
    std::__cxx11::string::operator=((string *)local_38,local_68);
    std::__cxx11::string::~string(local_68);
  }
  bVar2 = isOperation((string *)local_38);
  if (bVar2) {
    local_74 = getFormat(this);
    local_70._M_cur =
         (__node_type *)
         std::
         unordered_map<cs222::Instruction::Format,_unsigned_long,_std::hash<cs222::Instruction::Format>,_std::equal_to<cs222::Instruction::Format>,_std::allocator<std::pair<const_cs222::Instruction::Format,_unsigned_long>_>_>
         ::find((unordered_map<cs222::Instruction::Format,_unsigned_long,_std::hash<cs222::Instruction::Format>,_std::equal_to<cs222::Instruction::Format>,_std::allocator<std::pair<const_cs222::Instruction::Format,_unsigned_long>_>_>
                 *)Length,&local_74);
    pvVar5 = std::__detail::
             _Node_const_iterator<std::pair<const_cs222::Instruction::Format,_unsigned_long>,_false,_false>
             ::operator->((_Node_const_iterator<std::pair<const_cs222::Instruction::Format,_unsigned_long>,_false,_false>
                           *)&local_70);
    op.field_2._8_8_ = pvVar5->second;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_38,"WORD");
    if (bVar2) {
      op.field_2._8_8_ = 3;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38,"RESW");
      if (bVar2) {
        Operand::getValue_abi_cxx11_(&local_98,&(this->operands).first);
        uVar6 = std::__cxx11::stoul(&local_98,(size_t *)0x0,10);
        op.field_2._8_8_ = uVar6 * 3;
        std::__cxx11::string::~string((string *)&local_98);
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_38,"RESB");
        if (bVar2) {
          Operand::getValue_abi_cxx11_(&local_b8,&(this->operands).first);
          op.field_2._8_8_ = std::__cxx11::stoul(&local_b8,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)&local_b8);
        }
        else {
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_38,"BYTE");
          if (bVar2) {
            Operand::getValue_abi_cxx11_(&local_d8,&(this->operands).first);
            op.field_2._8_8_ = std::__cxx11::string::length();
            std::__cxx11::string::~string((string *)&local_d8);
            TVar3 = Operand::getType(&(this->operands).first);
            if (TVar3 == HEX_CONSTANT) {
              op.field_2._8_8_ = op.field_2._8_8_ >> 1;
            }
          }
          else {
            bVar2 = std::operator==(&this->label,"*");
            if (bVar2) {
              op.field_2._8_8_ = std::__cxx11::string::length();
              TVar3 = Operand::getType(&(this->operands).first);
              if (TVar3 == HEX_LITERAL) {
                op.field_2._8_8_ = op.field_2._8_8_ >> 1;
              }
            }
          }
        }
      }
    }
  }
  uVar1 = op.field_2._8_8_;
  std::__cxx11::string::~string((string *)local_38);
  return uVar1;
}

Assistant:

size_t Instruction::getLength() const
    {
        size_t length = 0;
        std::string op = operation;
        if (op[0] == '+')
            op = op.substr(1);

        if (isOperation(op))
        {
            length = Length.find(getFormat())->second;
        }
        else if (op == DIR_WORD)
        {
            length = 3;
        }
        else if (op == DIR_RESW)
        {
            length = 3 * std::stoul(operands.first.getValue());
        }
        else if (op == DIR_RESB)
        {
            length = std::stoul(operands.first.getValue());
        }
        else if (op == DIR_BYTE)
        {
            length = operands.first.getValue().length();
            if (operands.first.getType() == Operand::HEX_CONSTANT)
            {
                length /= 2;
            }
        }
        else if (label == "*") {
            length = operation.length();
            if (operands.first.getType() == Operand::HEX_LITERAL)
            {
                length /= 2;
            }
        }

        return length;
    }